

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_readSkippableFrame
                 (void *dst,size_t dstCapacity,uint *magicVariant,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  size_t sVar3;
  size_t skippableContentSize;
  size_t skippableFrameSize;
  U32 magicNumber;
  size_t srcSize_local;
  void *src_local;
  uint *magicVariant_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (srcSize < 8) {
    dst_local = (void *)0xffffffffffffffb8;
  }
  else {
    UVar1 = MEM_readLE32(src);
    sVar3 = readSkippableFrameSize(src,srcSize);
    dst_local = (void *)(sVar3 - 8);
    uVar2 = ZSTD_isSkippableFrame(src,srcSize);
    if (uVar2 == 0) {
      dst_local = (void *)0xfffffffffffffff2;
    }
    else if ((sVar3 < 8) || (srcSize < sVar3)) {
      dst_local = (void *)0xffffffffffffffb8;
    }
    else if (dstCapacity < dst_local) {
      dst_local = (void *)0xffffffffffffffba;
    }
    else {
      if ((dst_local != (void *)0x0) && (dst != (void *)0x0)) {
        memcpy(dst,(void *)((long)src + 8),(size_t)dst_local);
      }
      if (magicVariant != (uint *)0x0) {
        *magicVariant = UVar1 + 0xe7b2d5b0;
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

size_t ZSTD_readSkippableFrame(void* dst, size_t dstCapacity,
                               unsigned* magicVariant,  /* optional, can be NULL */
                         const void* src, size_t srcSize)
{
    RETURN_ERROR_IF(srcSize < ZSTD_SKIPPABLEHEADERSIZE, srcSize_wrong, "");

    {   U32 const magicNumber = MEM_readLE32(src);
        size_t skippableFrameSize = readSkippableFrameSize(src, srcSize);
        size_t skippableContentSize = skippableFrameSize - ZSTD_SKIPPABLEHEADERSIZE;

        /* check input validity */
        RETURN_ERROR_IF(!ZSTD_isSkippableFrame(src, srcSize), frameParameter_unsupported, "");
        RETURN_ERROR_IF(skippableFrameSize < ZSTD_SKIPPABLEHEADERSIZE || skippableFrameSize > srcSize, srcSize_wrong, "");
        RETURN_ERROR_IF(skippableContentSize > dstCapacity, dstSize_tooSmall, "");

        /* deliver payload */
        if (skippableContentSize > 0  && dst != NULL)
            ZSTD_memcpy(dst, (const BYTE *)src + ZSTD_SKIPPABLEHEADERSIZE, skippableContentSize);
        if (magicVariant != NULL)
            *magicVariant = magicNumber - ZSTD_MAGIC_SKIPPABLE_START;
        return skippableContentSize;
    }
}